

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidget::setCurrentPage(QCalendarWidget *this,int year,int month)

{
  int iVar1;
  int iVar2;
  QCalendarWidgetPrivate *this_00;
  QItemSelectionModel *pQVar3;
  int in_EDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  int daysInMonths;
  int day;
  QCalendarWidgetPrivate *d;
  int col;
  int row;
  QDate newDate;
  QCalendar cal;
  QDate currentDate;
  SelectionFlag in_stack_ffffffffffffff4c;
  QAbstractItemView *in_stack_ffffffffffffff50;
  QCalendarModel *this_01;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QCalendarWidgetPrivate *in_stack_ffffffffffffff60;
  undefined4 local_74;
  undefined1 local_70 [8];
  QDate in_stack_ffffffffffffff98;
  undefined1 local_58 [24];
  undefined1 *local_40;
  int local_38;
  int local_34;
  undefined8 local_30;
  QDate local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QCalendarWidget *)0x51f4f3);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (undefined1 *)QCalendarWidgetPrivate::getCurrentDate(this_00);
  local_20 = *(undefined8 *)&this_00->m_model->m_calendar;
  local_18 = local_20;
  iVar1 = QDate::day(&local_10,local_20);
  iVar2 = QCalendar::daysInMonth((int)&local_18,in_EDX);
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  QCalendarWidgetPrivate::showMonth
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  local_28.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = *(undefined8 *)&this_00->m_model->m_calendar;
  QDate::QDate(&local_28,in_ESI,in_EDX,iVar1,local_30);
  local_34 = -1;
  local_38 = -1;
  local_40 = (undefined1 *)local_28.jd;
  QtPrivate::QCalendarModel::cellForDate
            ((QCalendarModel *)this_00,in_stack_ffffffffffffff98,(int *)CONCAT44(iVar1,iVar2),
             (int *)in_stack_ffffffffffffff60);
  if ((local_34 != -1) && (local_38 != -1)) {
    pQVar3 = QAbstractItemView::selectionModel(in_stack_ffffffffffffff50);
    this_01 = this_00->m_model;
    iVar1 = local_34;
    iVar2 = local_38;
    QModelIndex::QModelIndex((QModelIndex *)0x51f69a);
    (**(code **)(*(long *)this_01 + 0x60))(local_58,this_01,iVar1,iVar2,local_70);
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)this_01,in_stack_ffffffffffffff4c);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,local_58,local_74);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::setCurrentPage(int year, int month)
{
    Q_D(QCalendarWidget);
    QDate currentDate = d->getCurrentDate();
    QCalendar cal = d->m_model->m_calendar;
    int day = currentDate.day(cal);
    int daysInMonths = cal.daysInMonth(month, year);
    if (day > daysInMonths)
        day = daysInMonths;

    d->showMonth(year, month);

    QDate newDate(year, month, day, d->m_model->m_calendar);
    int row = -1, col = -1;
    d->m_model->cellForDate(newDate, &row, &col);
    if (row != -1 && col != -1) {
        d->m_view->selectionModel()->setCurrentIndex(d->m_model->index(row, col),
                                                  QItemSelectionModel::NoUpdate);
    }
}